

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest::setup
          (TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest *this)

{
  MemoryLeakDetector *pMVar1;
  MemoryLeakFailure *pMVar2;
  DummyMemoryLeakDetector *this_00;
  TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest *this_local;
  
  GlobalMemoryAllocatorStash::save(&this->memoryAllocatorStash);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  this->detector = pMVar1;
  pMVar2 = MemoryLeakWarningPlugin::getGlobalFailureReporter();
  this->failureReporter = pMVar2;
  MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
  pMVar2 = (MemoryLeakFailure *)
           operator_new(8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                        ,0xce);
  DummyMemoryLeakFailure::DummyMemoryLeakFailure((DummyMemoryLeakFailure *)pMVar2);
  this->dummyReporter = pMVar2;
  this_00 = (DummyMemoryLeakDetector *)
            operator_new(0x1298,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                         ,0xcf);
  DummyMemoryLeakDetector::DummyMemoryLeakDetector(this_00,this->dummyReporter);
  this->dummyDetector = this_00;
  UtestShell::setCrashMethod(crashMethod);
  cpputestHasCrashed = false;
  return;
}

Assistant:

void setup() _override
    {
        memoryAllocatorStash.save();
        detector = MemoryLeakWarningPlugin::getGlobalDetector();
        failureReporter = MemoryLeakWarningPlugin::getGlobalFailureReporter();

        MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();

        dummyReporter = new DummyMemoryLeakFailure;
        dummyDetector = new DummyMemoryLeakDetector(dummyReporter);

        UtestShell::setCrashMethod(crashMethod);
        cpputestHasCrashed = false;
}